

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenerateViolationsReport
          (SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SolCheck *chk,bool param_3)

{
  bool bVar1;
  SolCheck *in_RSI;
  MemoryWriter wrt;
  size_type in_stack_fffffffffffffc58;
  SolCheck *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc78;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  allocator<char> *in_stack_fffffffffffffc90;
  reference in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [8];
  string *in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcff;
  MemoryWriter *in_stack_fffffffffffffd00;
  ViolSummary *in_stack_fffffffffffffd08;
  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffd10;
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  undefined1 local_279 [56];
  allocator<char> local_241 [157];
  int in_stack_fffffffffffffe5c;
  MemoryWriter *in_stack_fffffffffffffe60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *in_stack_fffffffffffffe68;
  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffe70;
  
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(local_241);
  bVar1 = SolCheck::HasAnyConViols(in_stack_fffffffffffffc60);
  if (bVar1) {
    SolCheck::VarViolBnds(in_RSI);
    std::array<mp::ViolSummary,_2UL>::at
              ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    in_stack_fffffffffffffca0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_279;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    Gen1Viol(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string((string *)(local_279 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_279);
    SolCheck::VarViolBnds(in_RSI);
    in_stack_fffffffffffffc98 =
         std::array<mp::ViolSummary,_2UL>::at
                   ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc60,
                    in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc90 = &local_2a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    Gen1Viol(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    SolCheck::VarViolIntty(in_RSI);
    std::array<mp::ViolSummary,_2UL>::at
              ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    Gen1Viol(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    SolCheck::VarViolIntty(in_RSI);
    std::array<mp::ViolSummary,_2UL>::at
              ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    Gen1Viol(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd0f);
  }
  SolCheck::ConViolAlg_abi_cxx11_(in_RSI);
  GenConViol(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe5c);
  SolCheck::ConViolLog_abi_cxx11_(in_RSI);
  GenConViol(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe5c);
  bVar1 = SolCheck::HasAnyObjViols(in_RSI);
  if (bVar1) {
    in_stack_fffffffffffffc60 = (SolCheck *)SolCheck::ObjViols(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    Gen1Viol(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_((BasicWriter<char> *)in_stack_fffffffffffffc98);
  SolCheck::SetReport(in_stack_fffffffffffffc60,(string *)in_RSI);
  std::__cxx11::string::~string(local_340);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffffc60);
  return;
}

Assistant:

void GenerateViolationsReport(
      SolCheck& chk, bool ) {
    fmt::MemoryWriter wrt;
    if (chk.HasAnyConViols()) {
      Gen1Viol(chk.VarViolBnds().at(0), wrt, true,
               "variable bounds");
      Gen1Viol(chk.VarViolBnds().at(1), wrt, true,
               "aux var bounds");
      Gen1Viol(chk.VarViolIntty().at(0), wrt, true,
               "variable integrality");
      Gen1Viol(chk.VarViolIntty().at(1), wrt, true,
               "aux var integrality");
    }
    GenConViol(chk.ConViolAlg(), wrt, 0);
    GenConViol(chk.ConViolLog(), wrt, 1);
    if (chk.HasAnyObjViols()) {
      Gen1Viol(chk.ObjViols(), wrt, true,
               "objective(s)");
    }
    chk.SetReport( wrt.str() );
  }